

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  Curl_easy *data_00;
  long lVar1;
  _Bool _Var2;
  char local_c8 [8];
  char key [128];
  int rc;
  Curl_easy *data;
  connectbundle *new_bundle;
  connectbundle *bundle;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  conncache *connc_local;
  
  data = (Curl_easy *)0x0;
  data_00 = conn->data;
  pcStack_18 = conn;
  conn_local = (connectdata *)connc;
  new_bundle = Curl_conncache_find_bundle(conn,(data_00->state).conn_cache);
  if (new_bundle == (connectbundle *)0x0) {
    bundle._4_4_ = bundle_create(data_00,(connectbundle **)&data);
    if (bundle._4_4_ != CURLE_OK) goto LAB_0015c47a;
    hashkey(pcStack_18,local_c8,0x80);
    _Var2 = conncache_add_bundle((data_00->state).conn_cache,local_c8,(connectbundle *)data);
    if (!_Var2) {
      bundle_destroy((connectbundle *)data);
      bundle._4_4_ = CURLE_OUT_OF_MEMORY;
      goto LAB_0015c47a;
    }
    new_bundle = (connectbundle *)data;
  }
  bundle._4_4_ = bundle_add_conn(new_bundle,pcStack_18);
  if (bundle._4_4_ == CURLE_OK) {
    lVar1 = *(long *)&(conn_local->chunk).state;
    *(long *)&(conn_local->chunk).state = lVar1 + 1;
    pcStack_18->connection_id = lVar1;
    *(long *)((conn_local->chunk).hexbuffer + 0x10) =
         *(long *)((conn_local->chunk).hexbuffer + 0x10) + 1;
  }
  else if (data != (Curl_easy *)0x0) {
    conncache_remove_bundle((data_00->state).conn_cache,(connectbundle *)data);
  }
LAB_0015c47a:
  if (data_00->share != (Curl_share *)0x0) {
    Curl_share_unlock(data_00,CURL_LOCK_DATA_CONNECT);
  }
  return bundle._4_4_;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct Curl_easy *data = conn->data;

  /* *find_bundle() locks the connection cache */
  bundle = Curl_conncache_find_bundle(conn, data->state.conn_cache);
  if(!bundle) {
    int rc;
    char key[128];

    result = bundle_create(data, &new_bundle);
    if(result) {
      goto unlock;
    }

    hashkey(conn, key, sizeof(key));
    rc = conncache_add_bundle(data->state.conn_cache, key, new_bundle);

    if(!rc) {
      bundle_destroy(new_bundle);
      result = CURLE_OUT_OF_MEMORY;
      goto unlock;
    }
    bundle = new_bundle;
  }

  result = bundle_add_conn(bundle, conn);
  if(result) {
    if(new_bundle)
      conncache_remove_bundle(data->state.conn_cache, new_bundle);
    goto unlock;
  }

  conn->connection_id = connc->next_connection_id++;
  connc->num_conn++;

  DEBUGF(infof(conn->data, "Added connection %ld. "
               "The cache now contains %" CURL_FORMAT_CURL_OFF_TU " members\n",
               conn->connection_id, (curl_off_t) connc->num_conn));

  unlock:
  CONN_UNLOCK(data);

  return result;
}